

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_quantization_transform.cc
# Opt level: O1

bool __thiscall
draco::AttributeQuantizationTransform::EncodeParameters
          (AttributeQuantizationTransform *this,EncoderBuffer *encoder_buffer)

{
  int iVar1;
  undefined1 local_19;
  
  iVar1 = this->quantization_bits_;
  if (iVar1 != -1) {
    if (encoder_buffer->bit_encoder_reserved_bytes_ < 1) {
      std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                ((vector<char,std::allocator<char>> *)encoder_buffer,
                 (encoder_buffer->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (this->min_values_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (this->min_values_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    if (encoder_buffer->bit_encoder_reserved_bytes_ < 1) {
      std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                ((vector<char,std::allocator<char>> *)encoder_buffer,
                 (encoder_buffer->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish,&this->range_,&this->field_0x2c);
    }
    local_19 = (undefined1)this->quantization_bits_;
    if (encoder_buffer->bit_encoder_reserved_bytes_ < 1) {
      std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                ((vector<char,std::allocator<char>> *)encoder_buffer,
                 (encoder_buffer->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_19,&stack0xffffffffffffffe8);
    }
  }
  return iVar1 != -1;
}

Assistant:

bool AttributeQuantizationTransform::InverseTransformAttribute(
    const PointAttribute &attribute, PointAttribute *target_attribute) {
  if (target_attribute->data_type() != DT_FLOAT32) {
    return false;
  }

  // Convert all quantized values back to floats.
  const int32_t max_quantized_value =
      (1u << static_cast<uint32_t>(quantization_bits_)) - 1;
  const int num_components = target_attribute->num_components();
  const int entry_size = sizeof(float) * num_components;
  const std::unique_ptr<float[]> att_val(new float[num_components]);
  int quant_val_id = 0;
  int out_byte_pos = 0;
  Dequantizer dequantizer;
  if (!dequantizer.Init(range_, max_quantized_value)) {
    return false;
  }
  const int32_t *const source_attribute_data =
      reinterpret_cast<const int32_t *>(
          attribute.GetAddress(AttributeValueIndex(0)));

  const int num_values = target_attribute->size();

  for (uint32_t i = 0; i < num_values; ++i) {
    for (int c = 0; c < num_components; ++c) {
      float value =
          dequantizer.DequantizeFloat(source_attribute_data[quant_val_id++]);
      value = value + min_values_[c];
      att_val[c] = value;
    }
    // Store the floating point value into the attribute buffer.
    target_attribute->buffer()->Write(out_byte_pos, att_val.get(), entry_size);
    out_byte_pos += entry_size;
  }
  return true;
}